

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckMapping(RtreeCheck *pCheck,int bLeaf,i64 iKey,i64 iVal)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  sqlite3_int64 sVar3;
  char *pcVar4;
  i64 ii;
  char *azSql [2];
  sqlite3_stmt *pStmt;
  int rc;
  i64 iVal_local;
  i64 iKey_local;
  int bLeaf_local;
  RtreeCheck *pCheck_local;
  
  azSql[0] = "SELECT nodeno FROM %Q.\'%q_rowid\' WHERE rowid=?1";
  if (pCheck->aCheckMapping[bLeaf] == (sqlite3_stmt *)0x0) {
    psVar2 = rtreeCheckPrepare(pCheck,azSql[(long)bLeaf + -1],pCheck->zDb,pCheck->zTab);
    pCheck->aCheckMapping[bLeaf] = psVar2;
  }
  if (pCheck->rc == 0) {
    azSql[1] = (char *)pCheck->aCheckMapping[bLeaf];
    sqlite3_bind_int64((sqlite3_stmt *)azSql[1],1,iKey);
    iVar1 = sqlite3_step((sqlite3_stmt *)azSql[1]);
    if (iVar1 == 0x65) {
      pcVar4 = "%_parent";
      if (bLeaf != 0) {
        pcVar4 = "%_rowid";
      }
      rtreeCheckAppendMsg(pCheck,"Mapping (%lld -> %lld) missing from %s table",iKey,iVal,pcVar4);
    }
    else if ((iVar1 == 100) &&
            (sVar3 = sqlite3_column_int64((sqlite3_stmt *)azSql[1],0), sVar3 != iVal)) {
      pcVar4 = "%_parent";
      if (bLeaf != 0) {
        pcVar4 = "%_rowid";
      }
      rtreeCheckAppendMsg(pCheck,"Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",iKey,
                          sVar3,pcVar4,iKey,iVal);
    }
    rtreeCheckReset(pCheck,(sqlite3_stmt *)azSql[1]);
  }
  return;
}

Assistant:

static void rtreeCheckMapping(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  int bLeaf,                      /* True for a leaf cell, false for interior */
  i64 iKey,                       /* Key for mapping */
  i64 iVal                        /* Expected value for mapping */
){
  int rc;
  sqlite3_stmt *pStmt;
  const char *azSql[2] = {
    "SELECT parentnode FROM %Q.'%q_parent' WHERE nodeno=?1",
    "SELECT nodeno FROM %Q.'%q_rowid' WHERE rowid=?1"
  };

  assert( bLeaf==0 || bLeaf==1 );
  if( pCheck->aCheckMapping[bLeaf]==0 ){
    pCheck->aCheckMapping[bLeaf] = rtreeCheckPrepare(pCheck,
        azSql[bLeaf], pCheck->zDb, pCheck->zTab
    );
  }
  if( pCheck->rc!=SQLITE_OK ) return;

  pStmt = pCheck->aCheckMapping[bLeaf];
  sqlite3_bind_int64(pStmt, 1, iKey);
  rc = sqlite3_step(pStmt);
  if( rc==SQLITE_DONE ){
    rtreeCheckAppendMsg(pCheck, "Mapping (%lld -> %lld) missing from %s table",
        iKey, iVal, (bLeaf ? "%_rowid" : "%_parent")
    );
  }else if( rc==SQLITE_ROW ){
    i64 ii = sqlite3_column_int64(pStmt, 0);
    if( ii!=iVal ){
      rtreeCheckAppendMsg(pCheck, 
          "Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",
          iKey, ii, (bLeaf ? "%_rowid" : "%_parent"), iKey, iVal
      );
    }
  }
  rtreeCheckReset(pCheck, pStmt);
}